

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

sexp_conflict
sexp_mutex_state(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict mutex)

{
  sexp_conflict psVar1;
  char *pcVar2;
  
  if ((((ulong)mutex & 3) != 0) ||
     ((long)(((ctx->value).type.setters)->value).context.mark_stack[0xc].end >> 1 !=
      (ulong)mutex->tag)) {
    psVar1 = (sexp_conflict)
             sexp_type_exception(ctx,self,(long)(((ctx->value).type.setters)->value).context.
                                                mark_stack[0xc].prev >> 1);
    return psVar1;
  }
  psVar1 = (mutex->value).type.slots;
  if ((mutex->value).type.getters == (sexp)0x3e) {
    pcVar2 = "not-abandoned";
    if (psVar1 == (sexp_conflict)0x0) {
      pcVar2 = "abandoned";
    }
  }
  else {
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x24)) {
      return psVar1;
    }
    pcVar2 = "not-owned";
  }
  psVar1 = (sexp_conflict)sexp_intern(ctx,pcVar2,0xffffffffffffffff);
  return psVar1;
}

Assistant:

sexp sexp_mutex_state (sexp ctx, sexp self, sexp_sint_t n, sexp mutex) {
  if (!sexp_mutexp(ctx, mutex))
    return sexp_type_exception(ctx, self, sexp_unbox_fixnum(sexp_global(ctx, SEXP_G_THREADS_POLLFDS_ID)), mutex);
  if (sexp_truep(sexp_mutex_lockp(mutex))) {
    if (sexp_contextp(sexp_mutex_thread(mutex)))
      return sexp_mutex_thread(mutex);
    else
      return sexp_intern(ctx, "not-owned", -1);
  } else {
    return sexp_intern(ctx, (sexp_mutex_thread(mutex) ? "not-abandoned" : "abandoned"), -1);
  }
}